

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O3

int handle_string(void *ctx,uchar *string,size_t string_length)

{
  int iVar1;
  yajl_val v;
  char *__dest;
  
  v = (yajl_val)calloc(1,0x28);
  if (v != (yajl_val)0x0) {
    v->type = yajl_t_string;
    __dest = (char *)malloc(string_length + 1);
    (v->u).string = __dest;
    if (__dest != (char *)0x0) {
      memcpy(__dest,string,string_length);
      __dest[string_length] = '\0';
      iVar1 = context_add_value((context_t *)ctx,v);
      return (uint)(iVar1 == 0);
    }
    free(v);
  }
  if (*(char **)((long)ctx + 0x10) != (char *)0x0) {
    snprintf(*(char **)((long)ctx + 0x10),*(size_t *)((long)ctx + 0x18),"Out of memory");
  }
  return 0;
}

Assistant:

static int handle_string (void *ctx,
                          const unsigned char *string, size_t string_length)
{
    yajl_val v;

    v = value_alloc (yajl_t_string);
    if (v == NULL)
        RETURN_ERROR ((context_t *) ctx, STATUS_ABORT, "Out of memory");

    v->u.string = malloc (string_length + 1);
    if (v->u.string == NULL)
    {
        free (v);
        RETURN_ERROR ((context_t *) ctx, STATUS_ABORT, "Out of memory");
    }
    memcpy(v->u.string, string, string_length);
    v->u.string[string_length] = 0;

    return ((context_add_value (ctx, v) == 0) ? STATUS_CONTINUE : STATUS_ABORT);
}